

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManSetupCutTriv(If_Man_t *p,If_Cut_t *pCut,int ObjId)

{
  If_Par_t *pIVar1;
  float fVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = *(uint *)&pCut->field_0x1c;
  *(uint *)&pCut->field_0x1c = uVar4 & 0xffffefff;
  *(uint *)&pCut->field_0x1c = (uVar4 & 0xefff) + (p->pPars->nLutSize & 0xffU) * 0x10000 + 0x1000000
  ;
  pIVar1 = p->pPars;
  uVar3 = (ulong)(uint)(ObjId << 8);
  if (pIVar1->fLiftLeaves == 0) {
    uVar3 = (ulong)(uint)ObjId;
  }
  fVar2 = (float)uVar3;
  pCut[1].Area = fVar2;
  iVar5 = (int)(uVar3 * 0x8421085 >> 0x20);
  pCut->uSign = 1 << ((char)(((uint)((int)fVar2 - iVar5) >> 1) + iVar5 >> 4) + (char)uVar3 & 0x1fU);
  uVar4 = 3;
  if (pIVar1->fUseTtPerm == 0) {
    uVar4 = -(uint)(pIVar1->fTruth == 0) | 2;
  }
  pCut->iCutFunc = uVar4;
  pCut->uMaskFunc = 0;
  if ((int)fVar2 < p->vObjs->nSize) {
    return;
  }
  __assert_fail("pCut->pLeaves[0] < p->vObjs->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                ,0x20c,"void If_ManSetupCutTriv(If_Man_t *, If_Cut_t *, int)");
}

Assistant:

void If_ManSetupCutTriv( If_Man_t * p, If_Cut_t * pCut, int ObjId )
{
    pCut->fCompl     = 0;
    pCut->nLimit     = p->pPars->nLutSize;
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = p->pPars->fLiftLeaves? (ObjId << 8) : ObjId;
    pCut->uSign      = If_ObjCutSign( pCut->pLeaves[0] );
    pCut->iCutFunc   = p->pPars->fUseTtPerm ? 3 : (p->pPars->fTruth ? 2: -1);
    pCut->uMaskFunc  = 0;
    assert( pCut->pLeaves[0] < p->vObjs->nSize );
}